

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

void __thiscall IR::AutoReuseOpnd::~AutoReuseOpnd(AutoReuseOpnd *this)

{
  AutoReuseOpnd *this_local;
  
  if (((this->wasInUse & 1U) == 0) && (Opnd::UnUse(this->opnd), (this->autoDelete & 1U) != 0)) {
    Opnd::Free(this->opnd,this->func);
  }
  return;
}

Assistant:

~AutoReuseOpnd()
    {
        if(wasInUse)
        {
            return;
        }

        opnd->UnUse();
        if(autoDelete)
        {
            opnd->Free(func);
        }
    }